

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O0

void __thiscall
TArray<SDLInputJoystick::AxisInfo,_SDLInputJoystick::AxisInfo>::~TArray
          (TArray<SDLInputJoystick::AxisInfo,_SDLInputJoystick::AxisInfo> *this)

{
  TArray<SDLInputJoystick::AxisInfo,_SDLInputJoystick::AxisInfo> *this_local;
  
  if (this->Array != (AxisInfo *)0x0) {
    if (this->Count != 0) {
      DoDelete(this,0,this->Count - 1);
    }
    M_Free(this->Array);
    this->Array = (AxisInfo *)0x0;
    this->Count = 0;
    this->Most = 0;
  }
  return;
}

Assistant:

~TArray ()
	{
		if (Array)
		{
			if (Count > 0)
			{
				DoDelete (0, Count-1);
			}
			M_Free (Array);
			Array = NULL;
			Count = 0;
			Most = 0;
		}
	}